

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImGuiViewportP *pIVar1;
  ImGuiWindow *window_00;
  ImGuiContext *ctx;
  bool bVar2;
  ImGuiViewportP **ppIVar3;
  ImDrawList *pIVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *local_80;
  ImGuiWindow *local_78;
  ImDrawData *draw_data;
  ImGuiViewportP *viewport_1;
  int n_3;
  int n_2;
  ImGuiWindow *window;
  ImGuiWindow *pIStack_38;
  int n_1;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiViewportP *viewport;
  int n;
  ImGuiContext *g;
  
  ctx = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1171,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  ctx->FrameCountRendered = ctx->FrameCount;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  for (viewport._4_4_ = 0; viewport._4_4_ != (ctx->Viewports).Size;
      viewport._4_4_ = viewport._4_4_ + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,viewport._4_4_);
    pIVar1 = *ppIVar3;
    ImDrawDataBuilder::Clear(&pIVar1->DrawDataBuilder);
    if (pIVar1->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar4 = GetBackgroundDrawList(&pIVar1->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers,pIVar4);
    }
  }
  if ((ctx->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_78 = (ImGuiWindow *)0x0;
  }
  else {
    local_78 = ctx->NavWindowingTarget->RootWindow;
  }
  pIStack_38 = local_78;
  if (ctx->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_80 = (ImGuiWindow *)0x0;
  }
  else {
    local_80 = ctx->NavWindowingListWindow;
  }
  windows_to_render_top_most[0] = local_80;
  for (window._4_4_ = 0; window._4_4_ != (ctx->Windows).Size; window._4_4_ = window._4_4_ + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,window._4_4_);
    window_00 = *ppIVar5;
    bVar2 = IsWindowActiveAndVisible(window_00);
    if ((((bVar2) && ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != pIStack_38)) &&
       (window_00 != windows_to_render_top_most[0])) {
      AddRootWindowToDrawData(window_00);
    }
  }
  for (viewport_1._4_4_ = 0; viewport_1._4_4_ < 2; viewport_1._4_4_ = viewport_1._4_4_ + 1) {
    if ((*(long *)((long)&stack0xffffffffffffffc8 + (long)viewport_1._4_4_ * 8) != 0) &&
       (bVar2 = IsWindowActiveAndVisible
                          (*(ImGuiWindow **)
                            ((long)&stack0xffffffffffffffc8 + (long)viewport_1._4_4_ * 8)), bVar2))
    {
      AddRootWindowToDrawData
                (*(ImGuiWindow **)((long)&stack0xffffffffffffffc8 + (long)viewport_1._4_4_ * 8));
    }
  }
  (ctx->IO).MetricsRenderIndices = 0;
  (ctx->IO).MetricsRenderVertices = 0;
  for (viewport_1._0_4_ = 0; (int)viewport_1 < (ctx->Viewports).Size;
      viewport_1._0_4_ = (int)viewport_1 + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,(int)viewport_1);
    pIVar1 = *ppIVar3;
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar1->DrawDataBuilder);
    if (((ctx->IO).MouseDrawCursor & 1U) != 0) {
      pIVar4 = GetForegroundDrawList(&pIVar1->super_ImGuiViewport);
      RenderMouseCursor(pIVar4,(ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,
                        0xffffffff,0xff000000,0x30000000);
    }
    if (pIVar1->DrawLists[1] != (ImDrawList *)0x0) {
      pIVar4 = GetForegroundDrawList(&pIVar1->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers,pIVar4);
    }
    SetupViewportDrawData(pIVar1,(pIVar1->DrawDataBuilder).Layers);
    (ctx->IO).MetricsRenderVertices =
         (pIVar1->DrawDataP).TotalVtxCount + (ctx->IO).MetricsRenderVertices;
    (ctx->IO).MetricsRenderIndices =
         (pIVar1->DrawDataP).TotalIdxCount + (ctx->IO).MetricsRenderIndices;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}